

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

uint16_t container_maximum(container_t *c,uint8_t type)

{
  ulong uVar1;
  short sVar2;
  long lVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  
  uVar4 = (uint)CONCAT71(in_register_00000031,type);
  if (uVar4 == 4) {
    uVar4 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar4 == '\x03') {
    lVar3 = (long)*c;
    if (lVar3 != 0) {
      return *(short *)(*(long *)((long)c + 8) + -2 + lVar3 * 4) +
             *(short *)(*(long *)((long)c + 8) + -4 + lVar3 * 4);
    }
  }
  else {
    if ((uVar4 & 0xff) != 2) {
      sVar2 = 1;
      uVar4 = 0x3ff;
      while( true ) {
        if (uVar4 == 0) {
          return 0;
        }
        uVar1 = *(ulong *)(*(long *)((long)c + 8) + (ulong)uVar4 * 8);
        if (uVar1 != 0) break;
        sVar2 = sVar2 + 0x40;
        uVar4 = uVar4 - 1;
      }
      lVar3 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      return -(sVar2 + ((ushort)lVar3 ^ 0x3f));
    }
    if ((long)*c != 0) {
      return *(uint16_t *)(*(long *)((long)c + 8) + -2 + (long)*c * 2);
    }
  }
  return 0;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}